

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainAI.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::TrainAI::TrainAI(TrainAI *this,BotSharedData *data,GoodType type,Train *train)

{
  int iVar1;
  Train *in_RCX;
  undefined4 in_EDX;
  _func_int **in_RSI;
  ISubBot *in_RDI;
  BotSharedData *in_stack_ffffffffffffffa0;
  Train *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  GoodType in_stack_ffffffffffffffd4;
  Train *in_stack_ffffffffffffffd8;
  
  ISubBot::ISubBot(in_RDI);
  in_RDI->_vptr_ISubBot = (_func_int **)&PTR__TrainAI_002d3f90;
  in_RDI[1]._vptr_ISubBot = in_RSI;
  *(undefined4 *)&in_RDI[2]._vptr_ISubBot = in_EDX;
  in_RDI[3]._vptr_ISubBot = (_func_int **)in_RCX;
  LineBlocker::LineBlocker
            ((LineBlocker *)in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             (BotSharedData *)(in_RDI + 4));
  PathCalculator::PathCalculator
            ((PathCalculator *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  in_RDI[0x1f]._vptr_ISubBot = (_func_int **)0x0;
  in_RDI[0x20]._vptr_ISubBot = (_func_int **)0x0;
  std::
  vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
  ::vector((vector<const_tiger::trains::world::Point_*,_std::allocator<const_tiger::trains::world::Point_*>_>
            *)0x24b66a);
  std::
  vector<std::pair<const_tiger::trains::world::IPost_*,_int>,_std::allocator<std::pair<const_tiger::trains::world::IPost_*,_int>_>_>
  ::vector((vector<std::pair<const_tiger::trains::world::IPost_*,_int>,_std::allocator<std::pair<const_tiger::trains::world::IPost_*,_int>_>_>
            *)0x24b680);
  iVar1 = trains::world::Train::getIdx(in_RCX);
  *(int *)&in_RDI[0x27]._vptr_ISubBot = iVar1;
  return;
}

Assistant:

TrainAI::TrainAI(BotSharedData *data, models::GoodType type, world::Train *train)
    : sharedData(data), type(type), train(train), lineBlocker(train, type, data),
      pathCalculator(train, data), lastPoint(nullptr), nextPoint(nullptr)
{
    id = train->getIdx();
}